

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::Type::BrandParameter> * __thiscall
capnp::Type::getBrandParameter
          (Maybe<capnp::Type::BrandParameter> *__return_storage_ptr__,Type *this)

{
  bool bVar1;
  anon_union_8_2_eba6ea51_for_Type_5 local_48;
  uint local_40;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Type *this_local;
  
  f.exception._6_1_ = isAnyPointer(this);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[66]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x31b,FAILED,"isAnyPointer()",
               "_kjCondition,\"Type::getBrandParameter() can only be called on AnyPointer types.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [66])"Type::getBrandParameter() can only be called on AnyPointer types.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  if ((this->field_4).schema == (RawBrandedSchema *)0x0) {
    kj::Maybe<capnp::Type::BrandParameter>::Maybe(__return_storage_ptr__);
  }
  else {
    local_48 = this->field_4;
    local_40 = (uint)(this->field_3).paramIndex;
    kj::Maybe<capnp::Type::BrandParameter>::Maybe
              (__return_storage_ptr__,(BrandParameter *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type::BrandParameter> Type::getBrandParameter() const {
  KJ_REQUIRE(isAnyPointer(), "Type::getBrandParameter() can only be called on AnyPointer types.");

  if (scopeId == 0) {
    return kj::none;
  } else {
    return BrandParameter { scopeId, paramIndex };
  }
}